

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

void __thiscall
wallet::LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB
          (LegacyScriptPubKeyMan *this,CPubKey *pubkey,bool internal,WalletBatch *batch)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *this_01;
  long lVar6;
  long in_FS_OFFSET;
  int64_t index;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  mapped_type local_b8;
  unique_lock<std::recursive_mutex> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CKeyPool local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_b0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b0);
  lVar6 = (this->super_LegacyDataSPKM).m_max_keypool_index;
  if (lVar6 == 0x7fffffffffffffff) {
    __assert_fail("m_max_keypool_index < std::numeric_limits<int64_t>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x561,
                  "void wallet::LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB(const CPubKey &, const bool, WalletBatch &)"
                 );
  }
  lVar6 = lVar6 + 1;
  (this->super_LegacyDataSPKM).m_max_keypool_index = lVar6;
  local_b8 = lVar6;
  CKeyPool::CKeyPool(&local_80,pubkey,internal);
  bVar2 = WalletBatch::WritePool(batch,lVar6,&local_80);
  if (bVar2) {
    this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
              &(this->super_LegacyDataSPKM).setExternalKeyPool;
    if (internal) {
      this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                &(this->super_LegacyDataSPKM).setInternalKeyPool;
    }
    std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>(this_01,&local_b8);
    mVar1 = local_b8;
    CPubKey::GetID((CKeyID *)&local_80,pubkey);
    pmVar3 = std::
             map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
             operator[](&(this->super_LegacyDataSPKM).m_pool_key_to_index,(key_type *)&local_80);
    *pmVar3 = mVar1;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"AddKeypoolPubkeyWithDB","")
    ;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_a0,": writing imported pubkey failed");
    local_80.nTime = (int64_t)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.nTime == paVar5) {
      local_80.vchPubKey.vch._8_8_ = paVar5->_M_allocated_capacity;
      local_80.vchPubKey.vch._16_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_80.nTime = (int64_t)(local_80.vchPubKey.vch + 8);
    }
    else {
      local_80.vchPubKey.vch._8_8_ = paVar5->_M_allocated_capacity;
    }
    local_80.vchPubKey.vch._0_8_ = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this_00,(string *)&local_80);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB(const CPubKey& pubkey, const bool internal, WalletBatch& batch)
{
    LOCK(cs_KeyStore);
    assert(m_max_keypool_index < std::numeric_limits<int64_t>::max()); // How in the hell did you use so many keys?
    int64_t index = ++m_max_keypool_index;
    if (!batch.WritePool(index, CKeyPool(pubkey, internal))) {
        throw std::runtime_error(std::string(__func__) + ": writing imported pubkey failed");
    }
    if (internal) {
        setInternalKeyPool.insert(index);
    } else {
        setExternalKeyPool.insert(index);
    }
    m_pool_key_to_index[pubkey.GetID()] = index;
}